

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O3

void __thiscall QObjectPrivate::setObjectNameWithoutBindings(QObjectPrivate *this,QString *name)

{
  ExtraData *pEVar1;
  
  pEVar1 = this->extraData;
  if (pEVar1 == (ExtraData *)0x0) {
    pEVar1 = (ExtraData *)operator_new(0x80);
    (pEVar1->propertyNames).d.d = (Data *)0x0;
    (pEVar1->propertyNames).d.ptr = (QByteArray *)0x0;
    (pEVar1->propertyNames).d.size = 0;
    (pEVar1->propertyValues).d.d = (Data *)0x0;
    (pEVar1->propertyValues).d.ptr = (QVariant *)0x0;
    (pEVar1->propertyValues).d.size = 0;
    (pEVar1->runningTimers).d.d = (Data *)0x0;
    (pEVar1->runningTimers).d.ptr = (TimerId *)0x0;
    (pEVar1->runningTimers).d.size = 0;
    (pEVar1->eventFilters).d.d = (Data *)0x0;
    (pEVar1->eventFilters).d.ptr = (QPointer<QObject> *)0x0;
    (pEVar1->eventFilters).d.size = 0;
    (pEVar1->objectName).super_QPropertyData<QString>.val.d.d = (Data *)0x0;
    (pEVar1->objectName).super_QPropertyData<QString>.val.d.ptr = (char16_t *)0x0;
    (pEVar1->objectName).super_QPropertyData<QString>.val.d.size = 0;
    pEVar1->parent = this;
    this->extraData = pEVar1;
  }
  QString::operator=((QString *)&pEVar1->objectName,name);
  return;
}

Assistant:

void QObjectPrivate::setObjectNameWithoutBindings(const QString &name)
{
    ensureExtraData();
    extraData->objectName.setValueBypassingBindings(name);
}